

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedResourcesMax::Cleanup(AdvancedResourcesMax *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers(this_00,0x10,this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,0xc,this->m_uniform_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,8,this->m_atomic_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,0x10,this->m_texture_buffer);
  glu::CallLogWrapper::glDeleteTextures(this_00,0x10,this->m_texture);
  glu::CallLogWrapper::glDeleteBuffers(this_00,8,this->m_image_buffer);
  glu::CallLogWrapper::glDeleteTextures(this_00,8,this->m_image);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(16, m_storage_buffer);
		glDeleteBuffers(12, m_uniform_buffer);
		glDeleteBuffers(8, m_atomic_buffer);
		glDeleteBuffers(16, m_texture_buffer);
		glDeleteTextures(16, m_texture);
		glDeleteBuffers(8, m_image_buffer);
		glDeleteTextures(8, m_image);
		return NO_ERROR;
	}